

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,char *filename)

{
  FILE *__stream;
  
  if (filename == (char *)0x0) {
    SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,0,"filename=<null>");
  }
  else {
    Clear(this);
    __stream = fopen(filename,"rb");
    if (__stream == (FILE *)0x0) {
      SetError(this,XML_ERROR_FILE_NOT_FOUND,0,"filename=%s",filename);
    }
    else {
      LoadFile(this,(FILE *)__stream);
      fclose(__stream);
    }
  }
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::LoadFile(const char* filename)
{
    if (!filename) {
        TIXMLASSERT(false);
        SetError(XML_ERROR_FILE_COULD_NOT_BE_OPENED, 0, "filename=<null>");
        return _errorID;
    }

    Clear();
    FILE* fp = callfopen(filename, "rb");
    if (!fp) {
        SetError(XML_ERROR_FILE_NOT_FOUND, 0, "filename=%s", filename);
        return _errorID;
    }
    LoadFile(fp);
    fclose(fp);
    return _errorID;
}